

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

bool __thiscall FM::OPNABase::Init(OPNABase *this,uint param_1,uint param_2,bool param_3)

{
  byte bVar1;
  
  bVar1 = (this->super_OPNBase).prescale;
  (this->super_OPNBase).prescale = 0xff;
  OPNBase::SetPrescaler(&this->super_OPNBase,(uint)bVar1);
  (*(this->super_OPNBase).super_Timer._vptr_Timer[3])(this);
  (this->super_OPNBase).fmvolume = 0x4000;
  PSG::SetVolume(&(this->super_OPNBase).psg,0);
  SetChannelMask(this,0);
  return true;
}

Assistant:

bool OPNABase::Init(uint, uint, bool)
{
	RebuildTimeTable();

	Reset();

	SetVolumeFM(0);
	SetVolumePSG(0);
	SetChannelMask(0);
	return true;
}